

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify_name_match_unittest.cc
# Opt level: O0

void __thiscall
bssl::VerifyNameMatchSimpleTest_ExtraAttrDoesNotMatch_Test::
~VerifyNameMatchSimpleTest_ExtraAttrDoesNotMatch_Test
          (VerifyNameMatchSimpleTest_ExtraAttrDoesNotMatch_Test *this)

{
  ~VerifyNameMatchSimpleTest_ExtraAttrDoesNotMatch_Test
            ((VerifyNameMatchSimpleTest_ExtraAttrDoesNotMatch_Test *)
             &this[-1].super_VerifyNameMatchSimpleTest.
              super_TestWithParam<std::tuple<const_char_*,_const_char_*>_>.super_Test.
              gtest_flag_saver_);
  return;
}

Assistant:

TEST_P(VerifyNameMatchSimpleTest, ExtraAttrDoesNotMatch) {
  std::string der;
  ASSERT_TRUE(LoadTestData("ascii", value_type(), suffix(), &der));
  std::string der_extra_attr;
  ASSERT_TRUE(LoadTestData("ascii", value_type(), suffix() + "-extra_attr",
                           &der_extra_attr));
  EXPECT_FALSE(VerifyNameMatch(SequenceValueFromString(der),
                               SequenceValueFromString(der_extra_attr)));
  EXPECT_FALSE(VerifyNameMatch(SequenceValueFromString(der_extra_attr),
                               SequenceValueFromString(der)));
}